

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int calculate_scanline_width(spng_ihdr *ihdr,uint32_t width,size_t *scanline_width)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  iVar1 = 0x50;
  if (width != 0 && ihdr != (spng_ihdr *)0x0) {
    if ((ulong)ihdr->color_type < 7) {
      lVar2 = *(long *)(&DAT_0010c528 + (ulong)ihdr->color_type * 8);
    }
    else {
      lVar2 = 0;
    }
    uVar3 = (ulong)width * lVar2 * (ulong)ihdr->bit_depth;
    iVar1 = 3;
    if (uVar3 < 0x7fffffff1) {
      *scanline_width = uVar3 + 0xf >> 3;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int calculate_scanline_width(const struct spng_ihdr *ihdr, uint32_t width, size_t *scanline_width)
{
    if(ihdr == NULL || !width) return SPNG_EINTERNAL;

    size_t res = num_channels(ihdr) * ihdr->bit_depth;

    if(res > SIZE_MAX / width) return SPNG_EOVERFLOW;
    res = res * width;

    res += 15; /* Filter byte + 7 for rounding */

    if(res < 15) return SPNG_EOVERFLOW;

    res /= 8;

    if(res > UINT32_MAX) return SPNG_EOVERFLOW;

    *scanline_width = res;

    return 0;
}